

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall PluginFverb::setParameterValue(PluginFverb *this,uint32_t index,float value)

{
  pointer this_00;
  float value_local;
  uint32_t index_local;
  PluginFverb *this_local;
  
  if (index < 0xf) {
    switch(index) {
    case 0:
      this->fBypass = value;
      break;
    default:
      if ((index == 0) || (0xb < index)) {
        d_safe_assert("index >= pIdDspFirst && index <= pIdDspLast",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                      ,0xc3);
      }
      else {
        this_00 = std::unique_ptr<Fverb,_std::default_delete<Fverb>_>::operator->(&this->fDsp);
        Fverb::set_parameter(this_00,index - 1,value);
      }
      break;
    case 0xc:
      LinearSmoother::setTarget(&this->fDry,value / 100.0);
      break;
    case 0xd:
      LinearSmoother::setTarget(&this->fWet,value / 100.0);
      break;
    case 0xe:
      this->fVintage = 0.5 <= value;
    }
  }
  else {
    d_safe_assert("index < kNumParameters",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                  ,0xb2);
  }
  return;
}

Assistant:

void PluginFverb::setParameterValue(uint32_t index, float value)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        fBypass = value;
        return;
    case pIdDry:
        fDry.setTarget(value / 100);
        return;
    case pIdWet:
        fWet.setTarget(value / 100);
        return;
    case pIdVintage:
        fVintage = value >= 0.5f;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    fDsp->set_parameter(index, value);
}